

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

real __thiscall
fasttext::HierarchicalSoftmaxLoss::forward
          (HierarchicalSoftmaxLoss *this,vector<int,_std::allocator<int>_> *targets,
          int32_t targetIndex,State *state,real lr,bool backprop)

{
  const_reference pvVar1;
  BinaryLogisticLoss *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  size_type sVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  real rVar3;
  int32_t i;
  vector<int,_std::allocator<int>_> *pathToRoot;
  vector<bool,_std::allocator<bool>_> *binaryCode;
  int32_t target;
  real loss;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  int iVar5;
  undefined4 local_2c;
  
  local_2c = 0.0;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)in_EDX);
  iVar4 = *pvVar1;
  this_00 = (BinaryLogisticLoss *)
            std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          *)(in_RDI + 0x58),(long)iVar4);
  this_01 = (vector<bool,_std::allocator<bool>_> *)
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x40),(long)iVar4);
  iVar4 = 0;
  while( true ) {
    iVar5 = iVar4;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)this_01);
    if (sVar2 <= (ulong)(long)iVar4) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)this_01,(long)iVar5);
    std::vector<bool,_std::allocator<bool>_>::operator[]
              (this_01,CONCAT44(iVar5,in_stack_ffffffffffffffb8));
    rVar3 = BinaryLogisticLoss::binaryLogistic
                      (this_00,(int32_t)((ulong)this_01 >> 0x20),
                       (State *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                       SUB81((ulong)in_RDI >> 0x38,0),(real)in_RDI,(bool)(iVar4 >> 0x1f));
    local_2c = rVar3 + local_2c;
    iVar4 = iVar5 + 1;
  }
  return local_2c;
}

Assistant:

real HierarchicalSoftmaxLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  real loss = 0.0;
  int32_t target = targets[targetIndex];
  const std::vector<bool>& binaryCode = codes_[target];
  const std::vector<int32_t>& pathToRoot = paths_[target];
  for (int32_t i = 0; i < pathToRoot.size(); i++) {
    loss += binaryLogistic(pathToRoot[i], state, binaryCode[i], lr, backprop);
  }
  return loss;
}